

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_dec.c
# Opt level: O1

void jpc_seglist_insert(jpc_dec_seglist_t *list,jpc_dec_seg_t *ins,jpc_dec_seg_t *node)

{
  jpc_dec_seg_s *pjVar1;
  jpc_dec_seg_t *pjVar2;
  
  node->prev = ins;
  if (ins == (jpc_dec_seg_t *)0x0) {
    pjVar1 = (jpc_dec_seg_s *)0x0;
    pjVar2 = (jpc_dec_seg_t *)list;
  }
  else {
    pjVar1 = ins->next;
    pjVar2 = ins;
  }
  node->prev = ins;
  node->next = pjVar1;
  pjVar2->next = node;
  if (pjVar1 != (jpc_dec_seg_s *)0x0) {
    list = (jpc_dec_seglist_t *)pjVar1;
  }
  ((jpc_dec_seg_s *)list)->prev = node;
  return;
}

Assistant:

void jpc_seglist_insert(jpc_dec_seglist_t *list, jpc_dec_seg_t *ins, jpc_dec_seg_t *node)
{
	jpc_dec_seg_t *prev;
	jpc_dec_seg_t *next;

	prev = ins;
	node->prev = prev;
	next = prev ? (prev->next) : 0;
	node->prev = prev;
	node->next = next;
	if (prev) {
		prev->next = node;
	} else {
		list->head = node;
	}
	if (next) {
		next->prev = node;
	} else {
		list->tail = node;
	}
}